

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

void __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
::splitFallback(BuilderT<embree::NodeRefPtr<4>,_embree::sse2::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
                *this,SetMB *set,SetMB *lset,SetMB *rset)

{
  BBox1f BVar1;
  BBox1f BVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  PrimRefVector pmVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  BBox1f *pBVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  uint uVar20;
  uint uVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pmVar7 = set->prims;
  uVar8 = (set->super_PrimInfoMB).object_range._begin;
  uVar9 = (set->super_PrimInfoMB).object_range._end;
  uVar12 = uVar8 + uVar9 + 1 >> 1;
  fVar27 = 0.0;
  local_a0 = 1.0;
  fVar35 = (float)DAT_01feb9f0;
  lVar10 = uVar12 - uVar8;
  fVar23 = DAT_01feb9f0._4_4_;
  fVar24 = DAT_01feb9f0._8_4_;
  fVar25 = DAT_01feb9f0._12_4_;
  aVar19 = _DAT_01feba00;
  auVar37 = _DAT_01feb9f0;
  aVar38 = _DAT_01feba00;
  auVar41 = _DAT_01feb9f0;
  if (uVar12 < uVar8 || lVar10 == 0) {
    uVar16 = 0;
    sVar13 = 0;
    local_88.m128 = _DAT_01feba00;
    fVar34 = 1.0;
    fVar26 = 0.0;
    fVar32 = 0.0;
    fVar33 = 1.0;
  }
  else {
    pBVar17 = &pmVar7->items[uVar8].time_range;
    fVar32 = 0.0;
    fVar33 = 1.0;
    fVar34 = 1.0;
    sVar13 = 0;
    uVar14 = 0;
    local_88 = _DAT_01feba00;
    fVar35 = 0.0;
    auVar43 = _DAT_01feb9f0;
    do {
      auVar36 = *(undefined1 (*) [16])&pBVar17[-8].lower;
      auVar44 = *(undefined1 (*) [16])(pBVar17 + -6);
      auVar3 = *(undefined1 (*) [16])(pBVar17 + -4);
      auVar4 = *(undefined1 (*) [16])(pBVar17 + -2);
      auVar43 = minps(auVar43,auVar3);
      auVar37 = minps(auVar37,auVar36);
      local_88.m128 = (__m128)maxps(local_88.m128,auVar4);
      aVar38.m128 = (__m128)maxps(aVar38.m128,auVar44);
      fVar23 = auVar44._0_4_ * 0.5 + auVar4._0_4_ * 0.5 + auVar36._0_4_ * 0.5 + auVar3._0_4_ * 0.5;
      fVar24 = auVar44._4_4_ * 0.5 + auVar4._4_4_ * 0.5 + auVar36._4_4_ * 0.5 + auVar3._4_4_ * 0.5;
      fVar25 = auVar44._8_4_ * 0.5 + auVar4._8_4_ * 0.5 + auVar36._8_4_ * 0.5 + auVar3._8_4_ * 0.5;
      fVar26 = auVar44._12_4_ * 0.5 + auVar4._12_4_ * 0.5 +
               auVar36._12_4_ * 0.5 + auVar3._12_4_ * 0.5;
      auVar36._4_4_ = fVar24;
      auVar36._0_4_ = fVar23;
      auVar36._8_4_ = fVar25;
      auVar36._12_4_ = fVar26;
      auVar41 = minps(auVar41,auVar36);
      auVar44._4_4_ = fVar24;
      auVar44._0_4_ = fVar23;
      auVar44._8_4_ = fVar25;
      auVar44._12_4_ = fVar26;
      aVar19.m128 = (__m128)maxps(aVar19.m128,auVar44);
      fVar23 = (*pBVar17).lower;
      if (fVar23 <= fVar34) {
        fVar34 = fVar23;
      }
      fVar24 = (*pBVar17).upper;
      sVar13 = sVar13 + (uint)pBVar17[-3].upper;
      uVar15 = (ulong)(uint)pBVar17[-1].upper;
      uVar16 = uVar15;
      if (uVar15 < uVar14) {
        uVar16 = uVar14;
      }
      fVar26 = fVar24;
      if (fVar24 <= fVar35) {
        fVar26 = fVar35;
      }
      uVar20 = (int)((uint)(uVar14 < uVar15) << 0x1f) >> 0x1f;
      uVar22 = (int)((uint)(uVar14 < uVar15) << 0x1f) >> 0x1f;
      fVar32 = (float)(~uVar20 & (uint)fVar32 | (uint)fVar23 & uVar20);
      fVar33 = (float)(~uVar22 & (uint)fVar33 | (uint)fVar24 & uVar22);
      pBVar17 = pBVar17 + 10;
      lVar10 = lVar10 + -1;
      uVar14 = uVar16;
      fVar35 = fVar26;
    } while (lVar10 != 0);
    fVar35 = auVar43._0_4_;
    fVar23 = auVar43._4_4_;
    fVar24 = auVar43._8_4_;
    fVar25 = auVar43._12_4_;
  }
  fVar39 = 0.0;
  fVar40 = 1.0;
  lVar10 = uVar9 - uVar12;
  aVar18 = _DAT_01feba00;
  auVar43 = _DAT_01feb9f0;
  aVar21 = _DAT_01feba00;
  auVar36 = _DAT_01feb9f0;
  aVar42 = _DAT_01feba00;
  auVar44 = _DAT_01feb9f0;
  if (uVar9 < uVar12 || lVar10 == 0) {
    uVar14 = 0;
    sVar11 = 0;
  }
  else {
    pBVar17 = &pmVar7->items[uVar12].time_range;
    fVar39 = 0.0;
    fVar40 = 1.0;
    local_a0 = 1.0;
    sVar11 = 0;
    uVar15 = 0;
    fVar28 = 0.0;
    do {
      auVar3 = *(undefined1 (*) [16])&pBVar17[-8].lower;
      auVar4 = *(undefined1 (*) [16])(pBVar17 + -6);
      auVar5 = *(undefined1 (*) [16])(pBVar17 + -4);
      auVar6 = *(undefined1 (*) [16])(pBVar17 + -2);
      auVar43 = minps(auVar43,auVar5);
      auVar44 = minps(auVar44,auVar3);
      aVar21.m128 = (__m128)maxps(aVar21.m128,auVar6);
      aVar42.m128 = (__m128)maxps(aVar42.m128,auVar4);
      fVar27 = auVar4._0_4_ * 0.5 + auVar6._0_4_ * 0.5 + auVar3._0_4_ * 0.5 + auVar5._0_4_ * 0.5;
      fVar29 = auVar4._4_4_ * 0.5 + auVar6._4_4_ * 0.5 + auVar3._4_4_ * 0.5 + auVar5._4_4_ * 0.5;
      fVar30 = auVar4._8_4_ * 0.5 + auVar6._8_4_ * 0.5 + auVar3._8_4_ * 0.5 + auVar5._8_4_ * 0.5;
      fVar31 = auVar4._12_4_ * 0.5 + auVar6._12_4_ * 0.5 + auVar3._12_4_ * 0.5 + auVar5._12_4_ * 0.5
      ;
      auVar3._4_4_ = fVar29;
      auVar3._0_4_ = fVar27;
      auVar3._8_4_ = fVar30;
      auVar3._12_4_ = fVar31;
      auVar36 = minps(auVar36,auVar3);
      auVar4._4_4_ = fVar29;
      auVar4._0_4_ = fVar27;
      auVar4._8_4_ = fVar30;
      auVar4._12_4_ = fVar31;
      aVar18.m128 = (__m128)maxps(aVar18.m128,auVar4);
      fVar29 = (*pBVar17).lower;
      fVar30 = (*pBVar17).upper;
      if (fVar29 <= local_a0) {
        local_a0 = fVar29;
      }
      fVar27 = fVar30;
      if (fVar30 <= fVar28) {
        fVar27 = fVar28;
      }
      sVar11 = sVar11 + (uint)pBVar17[-3].upper;
      uVar14 = (ulong)(uint)pBVar17[-1].upper;
      uVar20 = (int)((uint)(uVar15 < uVar14) << 0x1f) >> 0x1f;
      uVar22 = (int)((uint)(uVar15 < uVar14) << 0x1f) >> 0x1f;
      if (uVar14 < uVar15) {
        uVar14 = uVar15;
      }
      fVar39 = (float)(~uVar20 & (uint)fVar39 | (uint)fVar29 & uVar20);
      fVar40 = (float)(~uVar22 & (uint)fVar40 | (uint)fVar30 & uVar22);
      pBVar17 = pBVar17 + 10;
      lVar10 = lVar10 + -1;
      uVar15 = uVar14;
      fVar28 = fVar27;
    } while (lVar10 != 0);
  }
  BVar1 = (set->super_PrimInfoMB).time_range;
  local_98 = auVar37._0_8_;
  uStack_90 = auVar37._8_8_;
  *(undefined8 *)
   &(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower
    .field_0 = local_98;
  *(undefined8 *)
   ((long)&(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds0.lower.field_0 + 8) = uStack_90;
  (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
  field_0 = aVar38;
  (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
  field_0.m128[0] = fVar35;
  (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
  field_0.m128[1] = fVar23;
  (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
  field_0.m128[2] = fVar24;
  (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
  field_0.m128[3] = fVar25;
  *(undefined8 *)
   &(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper
    .field_0 = local_88._0_8_;
  *(undefined8 *)
   ((long)&(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.upper.field_0 + 8) = local_88._8_8_;
  local_58 = auVar41._0_8_;
  uStack_50 = auVar41._8_8_;
  *(undefined8 *)
   &(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0
       = local_58;
  *(undefined8 *)
   ((long)&(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
           field_0 + 8) = uStack_50;
  local_48 = aVar19._0_8_;
  uStack_40 = aVar19._8_8_;
  *(undefined8 *)
   &(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0
       = local_48;
  *(undefined8 *)
   ((long)&(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
           field_0 + 8) = uStack_40;
  (lset->super_PrimInfoMB).num_time_segments = sVar13;
  (lset->super_PrimInfoMB).max_num_time_segments = uVar16;
  (lset->super_PrimInfoMB).max_time_range.lower = fVar32;
  (lset->super_PrimInfoMB).max_time_range.upper = fVar33;
  (lset->super_PrimInfoMB).time_range.lower = fVar34;
  (lset->super_PrimInfoMB).time_range.upper = fVar26;
  lset->prims = pmVar7;
  (lset->super_PrimInfoMB).object_range._begin = uVar8;
  (lset->super_PrimInfoMB).object_range._end = uVar12;
  BVar2 = (lset->super_PrimInfoMB).time_range;
  fVar24 = BVar2.lower;
  fVar25 = BVar2.upper;
  fVar35 = BVar1.lower;
  fVar23 = BVar1.upper;
  uVar20 = -(uint)(fVar24 < fVar35);
  uVar22 = -(uint)(fVar25 < fVar23);
  (lset->super_PrimInfoMB).time_range =
       (BBox1f)(CONCAT44(~uVar22 & (uint)fVar23,~uVar20 & (uint)fVar24) |
               CONCAT44((uint)fVar25 & uVar22,(uint)fVar35 & uVar20));
  pmVar7 = set->prims;
  BVar1 = (set->super_PrimInfoMB).time_range;
  *(undefined1 (*) [16])
   (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
   field_0.m128 = auVar44;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
   (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
   field_0.m128 = aVar42;
  *(undefined1 (*) [16])
   (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
   field_0.m128 = auVar43;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
   (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
   field_0.m128 = aVar21;
  *(undefined1 (*) [16])
   (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.
   m128 = auVar36;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
   (rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.
   m128 = aVar18;
  (rset->super_PrimInfoMB).num_time_segments = sVar11;
  (rset->super_PrimInfoMB).max_num_time_segments = uVar14;
  (rset->super_PrimInfoMB).max_time_range.lower = fVar39;
  (rset->super_PrimInfoMB).max_time_range.upper = fVar40;
  (rset->super_PrimInfoMB).time_range.lower = local_a0;
  (rset->super_PrimInfoMB).time_range.upper = fVar27;
  rset->prims = pmVar7;
  (rset->super_PrimInfoMB).object_range._begin = uVar12;
  (rset->super_PrimInfoMB).object_range._end = uVar9;
  BVar2 = (rset->super_PrimInfoMB).time_range;
  fVar23 = BVar2.lower;
  fVar24 = BVar2.upper;
  fVar27 = BVar1.lower;
  fVar35 = BVar1.upper;
  uVar20 = -(uint)(fVar23 < fVar27);
  uVar22 = -(uint)(fVar24 < fVar35);
  (rset->super_PrimInfoMB).time_range =
       (BBox1f)(CONCAT44(~uVar22 & (uint)fVar35,~uVar20 & (uint)fVar23) |
               CONCAT44((uint)fVar24 & uVar22,(uint)fVar27 & uVar20));
  return;
}

Assistant:

void splitFallback(const SetMB& set, SetMB& lset, SetMB& rset)
          {
            mvector<PrimRefMB>& prims = *set.prims;

            const size_t begin = set.begin();
            const size_t end   = set.end();
            const size_t center = (begin + end + 1) / 2;

            PrimInfoMB linfo = empty;
            for (size_t i=begin; i<center; i++)
              linfo.add_primref(prims[i]);

            PrimInfoMB rinfo = empty;
            for (size_t i=center; i<end; i++)
              rinfo.add_primref(prims[i]);

            new (&lset) SetMB(linfo,set.prims,range<size_t>(begin,center),set.time_range);
            new (&rset) SetMB(rinfo,set.prims,range<size_t>(center,end  ),set.time_range);
          }